

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger container_findvalue(HSQUIRRELVM v)

{
  bool bVar1;
  SQInteger SVar2;
  SQObject *o_00;
  SQObject *closure_00;
  SQRESULT SVar3;
  SQObjectPtr *pSVar4;
  HSQUIRRELVM in_RDI;
  SQInteger iterTop;
  SQInteger nArgs;
  SQObject *closure;
  SQObject *o;
  SQChar *in_stack_ffffffffffffff48;
  HSQUIRRELVM in_stack_ffffffffffffff50;
  SQObjectPtr *in_stack_ffffffffffffff58;
  HSQUIRRELVM in_stack_ffffffffffffff60;
  HSQUIRRELVM invoke_err_handler;
  SQInteger in_stack_ffffffffffffff90;
  SQObjectValue in_stack_ffffffffffffff98;
  SQObjectPtr local_60 [2];
  SQInteger in_stack_ffffffffffffffc0;
  SQObjectValue in_stack_ffffffffffffffc8;
  SQRESULT local_8;
  
  SVar2 = sq_gettop(in_RDI);
  if (SVar2 < 4) {
    o_00 = &stack_get(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48)->
            super_SQObject;
    closure_00 = &stack_get(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48)->
                  super_SQObject;
    SVar2 = get_allowed_args_count(closure_00,4);
    sq_pushnull((HSQUIRRELVM)0x126d8e);
    while (SVar3 = sq_next((HSQUIRRELVM)in_stack_ffffffffffffffc8.pTable,in_stack_ffffffffffffffc0),
          -1 < SVar3) {
      sq_gettop(in_RDI);
      pSVar4 = (SQObjectPtr *)&stack0xffffffffffffffc0;
      invoke_err_handler = in_RDI;
      SQObjectPtr::SQObjectPtr(pSVar4,closure_00);
      SQVM::Push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
      SQObjectPtr::SQObjectPtr(local_60,o_00);
      SQVM::Push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
      stack_get(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48);
      SQVM::Push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (2 < SVar2) {
        in_stack_ffffffffffffff60 = in_RDI;
        stack_get(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48);
        SQVM::Push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      if (3 < SVar2) {
        in_stack_ffffffffffffff58 = (SQObjectPtr *)&stack0xffffffffffffff90;
        in_stack_ffffffffffffff50 = in_RDI;
        SQObjectPtr::SQObjectPtr(in_stack_ffffffffffffff58,o_00);
        SQVM::Push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
      }
      SVar3 = sq_call((HSQUIRRELVM)in_stack_ffffffffffffff98.pTable,in_stack_ffffffffffffff90,
                      (SQBool)pSVar4,(SQBool)invoke_err_handler);
      if (SVar3 < 0) {
        return -1;
      }
      pSVar4 = stack_get(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48);
      bVar1 = SQVM::IsFalse(pSVar4);
      if (!bVar1) {
        stack_get(in_stack_ffffffffffffff50,(SQInteger)in_RDI);
        SQVM::Push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        return 1;
      }
      SQVM::Pop(in_stack_ffffffffffffff60,(SQInteger)in_stack_ffffffffffffff58);
    }
    sq_pop(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48);
    SVar2 = sq_gettop(in_RDI);
    local_8 = (SQRESULT)(int)(uint)(2 < SVar2);
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  return local_8;
}

Assistant:

static SQInteger container_findvalue(HSQUIRRELVM v)
{
    if (sq_gettop(v) > 3)
        return sq_throwerror(v, _SC("Too many arguments for findvalue()"));

    SQObject &o = stack_get(v,1);
    SQObject &closure = stack_get(v, 2);
    SQInteger nArgs = get_allowed_args_count(closure, 4);

    sq_pushnull(v);
    while (SQ_SUCCEEDED(sq_next(v, 1))) {
        SQInteger iterTop = sq_gettop(v);
        v->Push(closure);
        v->Push(o);
        v->Push(stack_get(v, iterTop));
        if (nArgs >= 3)
            v->Push(stack_get(v, iterTop-1));
        if (nArgs >= 4)
            v->Push(o);

        if (SQ_FAILED(sq_call(v,nArgs,SQTrue,SQ_BASELIB_INVOKE_CB_ERR_HANDLER))) {
            return SQ_ERROR;
        }
        if (!v->IsFalse(stack_get(v, -1))) {
            v->Push(stack_get(v, iterTop));
            return 1;
        }
        v->Pop(4);
    }
    sq_pop(v, 1); // pops the iterator

    return sq_gettop(v) > 2 ? 1 : 0;
}